

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TasmanianSparseGridWrapC.cpp
# Opt level: O2

void tsgEstimateAnisotropicCoefficientsStatic(void *grid,char *sType,int output,int *coefficients)

{
  TypeDepth type;
  ostream *poVar1;
  ulong uVar2;
  uint uVar3;
  ulong uVar4;
  allocator<char> local_51;
  vector<int,_std::allocator<int>_> coeff;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&coeff,sType,&local_51);
  type = TasGrid::IO::getDepthTypeString((string *)&coeff);
  std::__cxx11::string::~string((string *)&coeff);
  if (type == type_none) {
    poVar1 = std::operator<<((ostream *)&std::cerr,"WARNING: incorrect depth type: ");
    poVar1 = std::operator<<(poVar1,sType);
    poVar1 = std::operator<<(poVar1,", defaulting to type_iptotal.");
    std::endl<char,std::char_traits<char>>(poVar1);
    type = type_iptotal;
  }
  if (*(long *)((long)grid + 8) == 0) {
    uVar3 = 0;
  }
  else {
    uVar3 = *(uint *)(*(long *)((long)grid + 8) + 0x10);
  }
  if ((type < type_iphyperbolic) && ((0xc4U >> (type & 0x1f) & 1) != 0)) {
    uVar3 = uVar3 * 2;
  }
  TasGrid::TasmanianSparseGrid::estimateAnisotropicCoefficients
            (&coeff,(TasmanianSparseGrid *)grid,type,output);
  uVar2 = 0;
  uVar4 = (ulong)uVar3;
  if ((int)uVar3 < 1) {
    uVar4 = uVar2;
  }
  for (; uVar4 != uVar2; uVar2 = uVar2 + 1) {
    coefficients[uVar2] =
         coeff.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_start[uVar2];
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&coeff.super__Vector_base<int,_std::allocator<int>_>);
  return;
}

Assistant:

void tsgEstimateAnisotropicCoefficientsStatic(void *grid, const char * sType, int output, int *coefficients){
    TypeDepth depth_type = IO::getDepthTypeString(sType);
    #ifndef NDEBUG
    if (depth_type == type_none){ cerr << "WARNING: incorrect depth type: " << sType << ", defaulting to type_iptotal." << endl; }
    #endif // NDEBUG
    if (depth_type == type_none){ depth_type = type_iptotal; }
    int num_coefficients = ((TasmanianSparseGrid*) grid)->getNumDimensions();
    if ((depth_type == type_curved) || (depth_type == type_ipcurved) || (depth_type == type_qpcurved)){
        num_coefficients *= 2;
    }
    auto coeff = ((TasmanianSparseGrid*) grid)->estimateAnisotropicCoefficients(depth_type, output);
    for(int i=0; i<num_coefficients; i++) coefficients[i] = coeff[i];
}